

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (CodedInputStream *input,uint32_t *value)

{
  bool bVar1;
  uint32_t *value_local;
  CodedInputStream *input_local;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,value);
  return bVar1;
}

Assistant:

inline bool
WireFormatLite::ReadPrimitive<uint32_t, WireFormatLite::TYPE_UINT32>(
    io::CodedInputStream* input, uint32_t* value) {
  return input->ReadVarint32(value);
}